

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetFuncNormTol(void *kinmem,sunrealtype fnormtol)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  sunrealtype sVar1;
  sunrealtype uround;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x2e7,"KINSetFuncNormTol",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      in_RDI->kin_fnormtol = in_XMM0_Qa;
    }
    else {
      sVar1 = (sunrealtype)SUNRpowerR(in_RDI->kin_uround,0x3fd5555555555555);
      in_RDI->kin_fnormtol = sVar1;
    }
    local_4 = 0;
  }
  else {
    KINProcessError(in_RDI,-2,0x2ef,"KINSetFuncNormTol",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"fnormtol < 0 illegal.");
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int KINSetFuncNormTol(void* kinmem, sunrealtype fnormtol)
{
  KINMem kin_mem;
  sunrealtype uround;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (fnormtol < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_FNORMTOL);
    return (KIN_ILL_INPUT);
  }

  if (fnormtol == ZERO)
  {
    uround                = kin_mem->kin_uround;
    kin_mem->kin_fnormtol = SUNRpowerR(uround, ONETHIRD);
  }
  else { kin_mem->kin_fnormtol = fnormtol; }

  return (KIN_SUCCESS);
}